

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEditor.cxx
# Opt level: O1

void __thiscall CodeEditor::~CodeEditor(CodeEditor *this)

{
  Fl_Text_Buffer *pFVar1;
  
  (this->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget
       = (_func_int **)&PTR__CodeEditor_002706f0;
  pFVar1 = (this->super_Fl_Text_Editor).super_Fl_Text_Display.mStyleBuffer;
  (this->super_Fl_Text_Editor).super_Fl_Text_Display.mStyleBuffer = (Fl_Text_Buffer *)0x0;
  if (pFVar1 != (Fl_Text_Buffer *)0x0) {
    Fl_Text_Buffer::~Fl_Text_Buffer(pFVar1);
    operator_delete(pFVar1,0x88);
  }
  pFVar1 = (this->super_Fl_Text_Editor).super_Fl_Text_Display.mBuffer;
  Fl_Text_Display::buffer((Fl_Text_Display *)this,(Fl_Text_Buffer *)0x0);
  if (pFVar1 != (Fl_Text_Buffer *)0x0) {
    Fl_Text_Buffer::~Fl_Text_Buffer(pFVar1);
    operator_delete(pFVar1,0x88);
  }
  Fl_Text_Editor::~Fl_Text_Editor(&this->super_Fl_Text_Editor);
  return;
}

Assistant:

CodeEditor::~CodeEditor() {
  Fl_Text_Buffer *buf = mStyleBuffer;
  mStyleBuffer = 0;
  delete buf;

  buf = mBuffer;
  buffer(0);
  delete buf;
}